

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O0

scanner * lightconf::config_format::make_scanner(scanner *__return_storage_ptr__,string *input)

{
  string *input_00;
  scanner_params local_48;
  undefined1 local_19;
  string *local_18;
  string *input_local;
  scanner *sc;
  
  local_19 = 0;
  local_18 = input;
  input_local = &__return_storage_ptr__->input_;
  scanner::scanner(__return_storage_ptr__);
  input_00 = local_18;
  scanner_params::scanner_params(&local_48,(scanner_params *)default_scanner_params);
  scanner::scan(__return_storage_ptr__,input_00,&local_48);
  scanner_params::~scanner_params(&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline scanner make_scanner(const std::string& input) {
    scanner sc;
    sc.scan(input);
    return sc;
}